

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp_bilinear.h
# Opt level: O1

void ncnn::linear_coeffs(int w,int outw,int *xofs,float *alpha,int align_corner)

{
  double dVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  int iVar4;
  double dVar5;
  double dVar6;
  float fVar7;
  undefined1 auVar8 [16];
  
  if (align_corner == 0) {
    dVar5 = (double)w;
    dVar6 = (double)outw;
  }
  else {
    dVar5 = (double)(w + -1);
    dVar6 = (double)(outw + -1);
  }
  if (0 < outw) {
    uVar3 = 0;
    do {
      dVar1 = ((double)(int)uVar3 + 0.5) * (dVar5 / dVar6) + -0.5;
      if (align_corner != 0) {
        dVar1 = (dVar5 / dVar6) * (double)(int)uVar3;
      }
      auVar8._0_4_ = (float)dVar1;
      auVar8._4_4_ = (int)((ulong)dVar1 >> 0x20);
      auVar8._8_8_ = 0;
      auVar2 = vroundss_avx(auVar8,auVar8,9);
      iVar4 = (int)auVar2._0_4_;
      fVar7 = 0.0;
      if (-1 < iVar4) {
        fVar7 = auVar8._0_4_ - auVar2._0_4_;
      }
      if (iVar4 < 1) {
        iVar4 = 0;
      }
      if (w + -1 <= iVar4) {
        iVar4 = w + -2;
        fVar7 = 1.0;
      }
      xofs[uVar3] = iVar4;
      alpha[uVar3 * 2] = 1.0 - fVar7;
      alpha[uVar3 * 2 + 1] = fVar7;
      uVar3 = uVar3 + 1;
    } while ((uint)outw != uVar3);
  }
  return;
}

Assistant:

static void linear_coeffs(int w, int outw, int* xofs, float* alpha, int align_corner)
{
    double scale = (double)w / outw;
    if (align_corner)
    {
        scale = (double)(w - 1) / (outw - 1);
    }

    for (int dx = 0; dx < outw; dx++)
    {
        float fx = (float)((dx + 0.5) * scale - 0.5);
        if (align_corner)
        {
            fx = (float)(dx * scale);
        }

        int sx = floor(fx);
        fx -= sx;

        if (sx < 0)
        {
            sx = 0;
            fx = 0.f;
        }
        if (sx >= w - 1)
        {
            sx = w - 2;
            fx = 1.f;
        }

        xofs[dx] = sx;

        alpha[dx * 2] = 1.f - fx;
        alpha[dx * 2 + 1] = fx;
    }
}